

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O2

String * __thiscall
Rml::StringUtilities::ToUTF8_abi_cxx11_
          (String *__return_storage_ptr__,StringUtilities *this,Character *characters,
          int num_characters)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  byte local_39;
  byte local_38;
  byte local_37;
  byte local_36;
  byte local_35;
  byte local_34;
  byte local_33;
  byte local_32;
  byte local_31;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar4 = 0;
  uVar6 = (ulong)characters & 0xffffffff;
  if ((int)characters < 1) {
    uVar6 = uVar4;
  }
  bVar5 = false;
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = *(uint *)(this + uVar4 * 4);
    bVar2 = bVar5;
    if (uVar1 < 0x80) {
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else {
      bVar3 = (byte)uVar1;
      if (uVar1 < 0x800) {
        local_39 = (byte)(uVar1 >> 6) | 0xc0;
        local_38 = bVar3 & 0x3f | 0x80;
        ::std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_39);
      }
      else if (uVar1 < 0x10000) {
        local_37 = (byte)(uVar1 >> 0xc) | 0xe0;
        local_36 = (byte)(uVar1 >> 6) & 0x3f | 0x80;
        local_35 = bVar3 & 0x3f | 0x80;
        ::std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_37);
      }
      else {
        bVar2 = true;
        if (uVar1 < 0x110000) {
          local_34 = (byte)(uVar1 >> 0x12) | 0xf0;
          local_33 = (byte)(uVar1 >> 0xc) & 0x3f | 0x80;
          local_32 = (byte)(uVar1 >> 6) & 0x3f | 0x80;
          local_31 = bVar3 & 0x3f | 0x80;
          ::std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&local_34);
          bVar2 = bVar5;
        }
      }
    }
    bVar5 = bVar2;
  }
  if (bVar5) {
    Log::Message(LT_WARNING,"One or more invalid code points encountered while encoding to UTF-8.");
  }
  return __return_storage_ptr__;
}

Assistant:

String StringUtilities::ToUTF8(const Character* characters, int num_characters)
{
	String result;
	result.reserve(num_characters);

	bool invalid_character = false;

	for (int i = 0; i < num_characters; i++)
	{
		char32_t c = (char32_t)characters[i];

		constexpr int l3 = 0b0000'0111;
		constexpr int l4 = 0b0000'1111;
		constexpr int l5 = 0b0001'1111;
		constexpr int l6 = 0b0011'1111;
		constexpr int h1 = 0b1000'0000;
		constexpr int h2 = 0b1100'0000;
		constexpr int h3 = 0b1110'0000;
		constexpr int h4 = 0b1111'0000;

		if (c < 0x80)
			result += (char)c;
		else if (c < 0x800)
			result += {char(((c >> 6) & l5) | h2), char((c & l6) | h1)};
		else if (c < 0x10000)
			result += {char(((c >> 12) & l4) | h3), char(((c >> 6) & l6) | h1), char((c & l6) | h1)};
		else if (c <= 0x10FFFF)
			result += {char(((c >> 18) & l3) | h4), char(((c >> 12) & l6) | h1), char(((c >> 6) & l6) | h1), char((c & l6) | h1)};
		else
			invalid_character = true;
	}

	if (invalid_character)
		Log::Message(Log::LT_WARNING, "One or more invalid code points encountered while encoding to UTF-8.");

	return result;
}